

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O2

int qc_socket_nagle_onoff(QcSocket *socket,int onoff)

{
  int iVar1;
  int iVar2;
  int flag;
  
  if (socket != (QcSocket *)0x0) {
    iVar1 = setsockopt(socket->sockfd,6,1,&flag,4);
    iVar2 = 0;
    if (iVar1 == -1) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x6b,"couldn\'t setsockopt(TCP_NODELAY)\n");
      iVar2 = -1;
    }
    return iVar2;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0x65);
  __assert_fail("socket",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x65,"int qc_socket_nagle_onoff(QcSocket *, int)");
}

Assistant:

int qc_socket_nagle_onoff(QcSocket *socket, int onoff)
{
    int flag, ret;

    qc_assert(socket);

    flag = onoff;
    ret = setsockopt(socket->sockfd, IPPROTO_TCP, TCP_NODELAY, (char *)&flag, sizeof(flag));

    if(ret == -1){
        qc_error("couldn't setsockopt(TCP_NODELAY)\n");
        return -1;
    }

    return 0;
}